

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O1

void __thiscall
cppcms::impl::mem_cache<cppcms::impl::process_settings>::nl_clear
          (mem_cache<cppcms::impl::process_settings> *this)

{
  pointer_list_type *this_00;
  
  std::_Rb_tree<$b22eed03$>::clear(&(this->timeout)._M_t);
  this_00 = &this->lru;
  std::__cxx11::
  _List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
  ::_M_clear(&this_00->
              super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
            );
  (this->lru).
  super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->lru).
  super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->lru).
  super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
  ._M_impl._M_node._M_size = 0;
  details::
  basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>
  ::clear(&(this->primary).impl_);
  details::
  basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>
  ::rehash(&(this->primary).impl_,(ulong)this->limit);
  details::basic_map<$d0c7d56a$>::clear(&(this->triggers).impl_);
  details::basic_map<$d0c7d56a$>::rehash(&(this->triggers).impl_,(ulong)this->limit);
  this->size = 0;
  this->triggers_count = 0;
  return;
}

Assistant:

void nl_clear()
	{
		timeout.clear();
		lru.clear();
		primary.clear();
		primary.rehash(limit);
		triggers.clear();
		triggers.rehash(limit);
		size = 0;
		triggers_count = 0;
	}